

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O2

pair<unsigned_int,_const_char_*> parse_hex(char *src,int size)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  runtime_error *this;
  ulong uVar4;
  int iVar5;
  pair<unsigned_int,_const_char_*> pVar6;
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  uVar3 = 0;
  for (uVar4 = 0; src + uVar4 < src + (uint)size; uVar4 = uVar4 + 1) {
    cVar1 = src[uVar4];
    iVar5 = (int)cVar1;
    if (cVar1 == '\0') break;
    uVar2 = (int)uVar3 * 0x10;
    uVar3 = (ulong)uVar2;
    if ((byte)(cVar1 + 0x9fU) < 6) {
      uVar3 = (ulong)((uVar2 + iVar5) - 0x57);
    }
    else if ((byte)(cVar1 + 0xbfU) < 6) {
      uVar3 = (ulong)((uVar2 + iVar5) - 0x37);
    }
    else {
      if (9 < (byte)(cVar1 - 0x30U)) break;
      uVar3 = (ulong)((uVar2 + iVar5) - 0x30);
    }
  }
  if ((uint)size == uVar4) {
    pVar6.second = src + (uint)size;
    pVar6._0_8_ = uVar3;
    return pVar6;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_98,size);
  std::operator+(&local_78,"expecting ",&sStack_98);
  std::operator+(&local_58,&local_78," hex chars at ");
  std::operator+(&local_38,&local_58,src);
  std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::pair<uint32_t, const char *> parse_hex(const char * src, int size) {
    const char * pos   = src;
    const char * end   = src + size;
    uint32_t     value = 0;
    for ( ; pos < end && *pos; pos++) {
        value <<= 4;
        char c = *pos;
        if ('a' <= c && c <= 'f') {
            value += c - 'a' + 10;
        } else if ('A' <= c && c <= 'F') {
            value += c - 'A' + 10;
        } else if ('0' <= c && c <= '9') {
            value += c - '0';
        } else {
            break;
        }
    }
    if (pos != end) {
        throw std::runtime_error("expecting " + std::to_string(size) + " hex chars at " + src);
    }
    return std::make_pair(value, pos);
}